

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O2

int DiagStackFrameSorter(void *dispatchHaltFrameAddress,void *diagStackFrame1,void *diagStackFrame2)

{
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  
  plVar1 = *diagStackFrame2;
  uVar2 = (**(code **)(**diagStackFrame1 + 0x20))();
  uVar3 = (**(code **)(*plVar1 + 0x20))(plVar1);
  return (uVar3 < uVar2) - 1 | 1;
}

Assistant:

static int __cdecl DiagStackFrameSorter(void * dispatchHaltFrameAddress, const void * diagStackFrame1, const void * diagStackFrame2)
{
    const DWORD_PTR *p1 = reinterpret_cast<const DWORD_PTR*>(diagStackFrame1);
    const DWORD_PTR *p2 = reinterpret_cast<const DWORD_PTR*>(diagStackFrame2);

    Js::DiagStackFrame * pStackFrame1 = (Js::DiagStackFrame *)(*p1);
    Js::DiagStackFrame * pStackFrame2 = (Js::DiagStackFrame *)(*p2);

    DWORD_PTR stackAddress1 = pStackFrame1->GetStackAddress();
    DWORD_PTR stackAddress2 = pStackFrame2->GetStackAddress();

    return stackAddress1 > stackAddress2 ? 1 : -1;
}